

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvisualmatrix.cpp
# Opt level: O2

void VisualMatrix<std::complex<double>>
               (TPZFMatrix<std::complex<double>_> *matrix,string *outfilename)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = std::__cxx11::string::rfind((char *)outfilename,0x134b2c6);
  iVar3 = std::__cxx11::string::rfind((char *)outfilename,0x1314455);
  iVar1 = (int)outfilename->_M_string_length;
  if (iVar1 - iVar2 == 3) {
    VisualMatrixDX<std::complex<double>>(matrix,outfilename);
    return;
  }
  if (iVar1 - iVar3 == 4) {
    VisualMatrixVTK<std::complex<double>>(matrix,outfilename);
    return;
  }
  std::operator<<((ostream *)&std::cout,"visualmatrix output was not created\n");
  return;
}

Assistant:

void VisualMatrix(TPZFMatrix<TVar> & matrix, const std::string &outfilename)
{
	int posdx = outfilename.rfind(".dx");
	int posvtk = outfilename.rfind(".vtk");
	int filelength = outfilename.size();
	if(filelength-posdx == 3) {
		VisualMatrixDX(matrix,outfilename);
	} else if(filelength-posvtk == 4) {
		VisualMatrixVTK(matrix,outfilename);
	} else {
		cout << "visualmatrix output was not created\n";
	}
}